

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManSerializer.cpp
# Opt level: O0

string * __thiscall
adios2::format::DataManSerializer::GetDestination_abi_cxx11_(DataManSerializer *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x238));
  return in_RDI;
}

Assistant:

std::string DataManSerializer::GetDestination() { return m_Destination; }